

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O0

string * __thiscall
CommandLineParser::getNextOptionalParameter_abi_cxx11_
          (string *__return_storage_ptr__,CommandLineParser *this)

{
  bool bVar1;
  bool local_9a;
  allocator<char> local_74;
  byte local_73;
  byte local_72;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  CommandLineParser *local_18;
  CommandLineParser *this_local;
  
  local_18 = this;
  this_local = (CommandLineParser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  local_72 = 0;
  local_73 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"-",&local_39);
  bVar1 = argumentStartsWith(this,&local_38);
  local_9a = true;
  if (!bVar1) {
    std::allocator<char>::allocator();
    local_72 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,":",&local_71);
    local_73 = 1;
    local_9a = argumentStartsWith(this,&local_70);
  }
  if ((local_73 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_72 & 1) != 0) {
    std::allocator<char>::~allocator(&local_71);
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (local_9a == false) {
    getNextArgument_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_74);
    std::allocator<char>::~allocator(&local_74);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
CommandLineParser::getNextOptionalParameter()
{
  if ( argumentStartsWith( "-" )  ||  argumentStartsWith( ":" ) )
    return "";
  return getNextArgument();
}